

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

int COVER_strict_cmp(void *lp,void *rp)

{
  uint uVar1;
  
  uVar1 = memcmp(g_coverCtx->samples + *lp,g_coverCtx->samples + *rp,(ulong)g_coverCtx->d);
  if (uVar1 == 0) {
    uVar1 = -(uint)(lp < rp) | 1;
  }
  return uVar1;
}

Assistant:

static int WIN_CDECL COVER_strict_cmp(const void *lp, const void *rp) {
  int result = COVER_cmp(g_coverCtx, lp, rp);
  if (result == 0) {
    result = lp < rp ? -1 : 1;
  }
  return result;
}